

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O0

int json_vunpack_ex(json_t *root,json_error_t *error,size_t flags,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  undefined1 auStack_d8 [8];
  va_list ap_copy;
  undefined1 local_b8 [8];
  scanner_t s;
  __va_list_tag *ap_local;
  char *fmt_local;
  size_t flags_local;
  json_error_t *error_local;
  json_t *root_local;
  
  s._120_8_ = ap;
  if (root == (json_t *)0x0) {
    jsonp_error_init(error,"<root>");
    jsonp_error_set(error,-1,-1,0,json_error_null_value,"NULL root value");
    root_local._4_4_ = -1;
  }
  else if ((fmt == (char *)0x0) || (*fmt == '\0')) {
    jsonp_error_init(error,"<format>");
    jsonp_error_set(error,-1,-1,0,json_error_invalid_argument,"NULL or empty format string");
    root_local._4_4_ = -1;
  }
  else {
    jsonp_error_init(error,(char *)0x0);
    scanner_init((scanner_t *)local_b8,error,flags,fmt);
    next_token((scanner_t *)local_b8);
    ap_copy[0].overflow_arg_area = *(void **)(s._120_8_ + 0x10);
    auStack_d8 = *(undefined1 (*) [8])s._120_8_;
    ap_copy[0]._0_8_ = *(undefined8 *)(s._120_8_ + 8);
    iVar1 = unpack((scanner_t *)local_b8,root,(va_list *)auStack_d8);
    if (iVar1 == 0) {
      next_token((scanner_t *)local_b8);
      if ((char)s.token.pos == '\0') {
        root_local._4_4_ = 0;
      }
      else {
        set_error((scanner_t *)local_b8,"<format>",json_error_invalid_format,
                  "Garbage after format string");
        root_local._4_4_ = -1;
      }
    }
    else {
      root_local._4_4_ = -1;
    }
  }
  return root_local._4_4_;
}

Assistant:

int json_vunpack_ex(json_t *root, json_error_t *error, size_t flags, const char *fmt,
                    va_list ap) {
    scanner_t s;
    va_list ap_copy;

    if (!root) {
        jsonp_error_init(error, "<root>");
        jsonp_error_set(error, -1, -1, 0, json_error_null_value, "NULL root value");
        return -1;
    }

    if (!fmt || !*fmt) {
        jsonp_error_init(error, "<format>");
        jsonp_error_set(error, -1, -1, 0, json_error_invalid_argument,
                        "NULL or empty format string");
        return -1;
    }
    jsonp_error_init(error, NULL);

    scanner_init(&s, error, flags, fmt);
    next_token(&s);

    va_copy(ap_copy, ap);
    if (unpack(&s, root, &ap_copy)) {
        va_end(ap_copy);
        return -1;
    }
    va_end(ap_copy);

    next_token(&s);
    if (token(&s)) {
        set_error(&s, "<format>", json_error_invalid_format,
                  "Garbage after format string");
        return -1;
    }

    return 0;
}